

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbRead(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *p_00;
  MemStore *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  memdbEnter((MemStore *)p_00);
  if (*(long *)p_00 < iOfst + iAmt) {
    memset(zBuf,0,(long)iAmt);
    if (iOfst < *(long *)p_00) {
      memcpy(zBuf,p_00->xWrite + iOfst,*(long *)p_00 - iOfst);
    }
    memdbLeave((MemStore *)p_00);
    pFile_local._4_4_ = 0x20a;
  }
  else {
    memcpy(zBuf,p_00->xWrite + iOfst,(long)iAmt);
    memdbLeave((MemStore *)p_00);
    pFile_local._4_4_ = 0;
  }
  return pFile_local._4_4_;
}

Assistant:

static int memdbRead(
  sqlite3_file *pFile,
  void *zBuf,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( iOfst+iAmt>p->sz ){
    memset(zBuf, 0, iAmt);
    if( iOfst<p->sz ) memcpy(zBuf, p->aData+iOfst, p->sz - iOfst);
    memdbLeave(p);
    return SQLITE_IOERR_SHORT_READ;
  }
  memcpy(zBuf, p->aData+iOfst, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}